

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlRelaxNGValidatePushElement(void)

{
  int iVar1;
  int iVar2;
  xmlDocPtr val;
  xmlNodePtr val_00;
  uint local_44;
  int n_elem;
  xmlNodePtr elem;
  int n_doc;
  xmlDocPtr doc;
  int n_ctxt;
  xmlRelaxNGValidCtxtPtr ctxt;
  int ret_val;
  int mem_base;
  int test_ret;
  
  ret_val = 0;
  for (doc._4_4_ = 0; (int)doc._4_4_ < 1; doc._4_4_ = doc._4_4_ + 1) {
    for (elem._4_4_ = 0; (int)elem._4_4_ < 4; elem._4_4_ = elem._4_4_ + 1) {
      for (local_44 = 0; (int)local_44 < 3; local_44 = local_44 + 1) {
        iVar1 = xmlMemBlocks();
        val = gen_xmlDocPtr(elem._4_4_,1);
        val_00 = gen_xmlNodePtr(local_44,2);
        iVar2 = xmlRelaxNGValidatePushElement(0,val,val_00);
        desret_int(iVar2);
        call_tests = call_tests + 1;
        des_xmlDocPtr(elem._4_4_,val,1);
        des_xmlNodePtr(local_44,val_00,2);
        xmlResetLastError();
        iVar2 = xmlMemBlocks();
        if (iVar1 != iVar2) {
          iVar2 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlRelaxNGValidatePushElement",
                 (ulong)(uint)(iVar2 - iVar1));
          ret_val = ret_val + 1;
          printf(" %d",(ulong)doc._4_4_);
          printf(" %d",(ulong)elem._4_4_);
          printf(" %d",(ulong)local_44);
          printf("\n");
        }
      }
    }
  }
  function_tests = function_tests + 1;
  return ret_val;
}

Assistant:

static int
test_xmlRelaxNGValidatePushElement(void) {
    int test_ret = 0;

#if defined(LIBXML_RELAXNG_ENABLED)
    int mem_base;
    int ret_val;
    xmlRelaxNGValidCtxtPtr ctxt; /* the validation context */
    int n_ctxt;
    xmlDocPtr doc; /* a document instance */
    int n_doc;
    xmlNodePtr elem; /* an element instance */
    int n_elem;

    for (n_ctxt = 0;n_ctxt < gen_nb_xmlRelaxNGValidCtxtPtr;n_ctxt++) {
    for (n_doc = 0;n_doc < gen_nb_xmlDocPtr;n_doc++) {
    for (n_elem = 0;n_elem < gen_nb_xmlNodePtr;n_elem++) {
        mem_base = xmlMemBlocks();
        ctxt = gen_xmlRelaxNGValidCtxtPtr(n_ctxt, 0);
        doc = gen_xmlDocPtr(n_doc, 1);
        elem = gen_xmlNodePtr(n_elem, 2);

        ret_val = xmlRelaxNGValidatePushElement(ctxt, doc, elem);
        desret_int(ret_val);
        call_tests++;
        des_xmlRelaxNGValidCtxtPtr(n_ctxt, ctxt, 0);
        des_xmlDocPtr(n_doc, doc, 1);
        des_xmlNodePtr(n_elem, elem, 2);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlRelaxNGValidatePushElement",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_ctxt);
            printf(" %d", n_doc);
            printf(" %d", n_elem);
            printf("\n");
        }
    }
    }
    }
    function_tests++;
#endif

    return(test_ret);
}